

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_unary_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t uVar1;
  int iVar2;
  bool bVar3;
  uint16_t prev_exp;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  uVar1 = *exp_idx;
  while( true ) {
    iVar2 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_OPERATOR_MATH,0);
    bVar3 = false;
    if (iVar2 == 0) {
      bVar3 = exp->expr[exp->expr_pos[*exp_idx]] == '-';
    }
    if (!bVar3) break;
    exp_repeat_push(exp,uVar1,7);
    *exp_idx = *exp_idx + 1;
  }
  uVar1 = *exp_idx;
  iVar2 = reparse_path_expr(ctx,exp,exp_idx);
  while( true ) {
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_OPERATOR_UNI,0);
    if (iVar2 != 0) break;
    exp_repeat_push(exp,uVar1,8);
    *exp_idx = *exp_idx + 1;
    iVar2 = reparse_path_expr(ctx,exp,exp_idx);
  }
  return 0;
}

Assistant:

static int
reparse_unary_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_exp;

    /* ('-')* */
    prev_exp = *exp_idx;
    while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNARY);
        ++(*exp_idx);
    }

    /* PathExpr */
    prev_exp = *exp_idx;
    if (reparse_path_expr(ctx, exp, exp_idx)) {
        return -1;
    }

    /* ('|' PathExpr)* */
    while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_UNI, 0)) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNION);
        ++(*exp_idx);

        if (reparse_path_expr(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}